

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_service.cc
# Opt level: O0

ps_err_e ps_pcontinue(ps_prochandle *ph)

{
  Process *p;
  ps_prochandle *ph_local;
  
  (**(code **)(*(long *)ph + 0x38))();
  return PS_OK;
}

Assistant:

ps_err_e
ps_pcontinue(const struct ps_prochandle *ph)
{
    auto p = const_cast<Process *>(static_cast<const Process *>(ph));
    try {
        p->resumeProcess();
        return PS_OK;
    }
    catch (...) {
        return PS_ERR;
    }
}